

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

bool r_exec::gtr(Context *context,uint16_t *index)

{
  byte bVar1;
  char cVar2;
  uint16_t uVar3;
  Atom *pAVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  Atom local_88 [4];
  Atom local_84 [7];
  byte local_7d;
  undefined4 local_7c;
  Atom local_78 [3];
  bool r_1;
  byte local_71;
  undefined1 local_70 [7];
  bool r;
  undefined1 local_60 [8];
  Context rhs;
  Context local_40;
  undefined1 local_30 [8];
  Context lhs;
  uint16_t *index_local;
  Context *context_local;
  
  lhs.implementation = (_Context *)index;
  Context::getChild(&local_40,(uint16_t)context);
  Context::operator*((Context *)local_30);
  Context::~Context(&local_40);
  Context::getChild((Context *)local_70,(uint16_t)context);
  Context::operator*((Context *)local_60);
  Context::~Context((Context *)local_70);
  Context::operator[]((Context *)local_30,0);
  bVar1 = r_code::Atom::isFloat();
  if ((bVar1 & 1) == 0) {
    Context::operator[]((Context *)local_30,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x39) {
      Context::operator[]((Context *)local_60,0);
      cVar2 = r_code::Atom::getDescriptor();
      if (cVar2 == -0x39) {
        pAVar4 = Context::operator[]((Context *)local_30,0);
        uVar5 = r_code::Utils::GetTimestamp(pAVar4);
        pAVar4 = Context::operator[]((Context *)local_60,0);
        uVar6 = r_code::Utils::GetTimestamp(pAVar4);
        local_7d = uVar6 < uVar5;
        r_code::Atom::Boolean(SUB81(local_84,0));
        uVar3 = Context::setAtomicResult(context,local_84);
        *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
        r_code::Atom::~Atom(local_84);
        context_local._7_1_ = (bool)(local_7d & 1);
        goto LAB_0028119a;
      }
    }
  }
  else {
    Context::operator[]((Context *)local_60,0);
    bVar1 = r_code::Atom::isFloat();
    if ((bVar1 & 1) != 0) {
      Context::operator[]((Context *)local_30,0);
      fVar7 = (float)r_code::Atom::asFloat();
      Context::operator[]((Context *)local_60,0);
      fVar8 = (float)r_code::Atom::asFloat();
      local_71 = fVar8 < fVar7;
      r_code::Atom::Boolean(SUB81(local_78,0));
      uVar3 = Context::setAtomicResult(context,local_78);
      *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
      r_code::Atom::~Atom(local_78);
      context_local._7_1_ = (bool)(local_71 & 1);
      goto LAB_0028119a;
    }
  }
  r_code::Atom::UndefinedBoolean();
  uVar3 = Context::setAtomicResult(context,local_88);
  *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
  r_code::Atom::~Atom(local_88);
  context_local._7_1_ = false;
LAB_0028119a:
  local_7c = 1;
  Context::~Context((Context *)local_60);
  Context::~Context((Context *)local_30);
  return context_local._7_1_;
}

Assistant:

bool gtr(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);

    if (lhs[0].isFloat()) {
        if (rhs[0].isFloat()) {
            bool r = lhs[0].asFloat() > rhs[0].asFloat();
            index = context.setAtomicResult(Atom::Boolean(r));
            return r;
        }
    } else if (lhs[0].getDescriptor() == Atom::TIMESTAMP) {
        if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            bool r = Utils::GetTimestamp(&lhs[0]) > Utils::GetTimestamp(&rhs[0]);
            index = context.setAtomicResult(Atom::Boolean(r));
            return r;
        }
    }

    index = context.setAtomicResult(Atom::UndefinedBoolean());
    return false;
}